

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::VariableTypename::VariableTypename(VariableTypename *this,VariableTypename *typename_)

{
  Token local_48;
  VariableTypename *local_18;
  VariableTypename *typename__local;
  VariableTypename *this_local;
  
  local_18 = typename_;
  typename__local = this;
  Token::Token(&local_48,&typename_->m_identifier);
  VariableTypename(this,&local_48);
  Token::~Token(&local_48);
  return;
}

Assistant:

VariableTypename::VariableTypename(const VariableTypename &typename_) :
            VariableTypename{typename_.m_identifier} {
    }